

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O0

int wasm::Bits::countLeadingZeroes(uint64_t v)

{
  long lVar1;
  uint64_t v_local;
  
  if (v == 0) {
    v_local._4_4_ = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (v != 0) {
      for (; v >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    v_local._4_4_ = (uint)lVar1 ^ 0x3f;
  }
  return v_local._4_4_;
}

Assistant:

int countLeadingZeroes(uint64_t v) {
  if (v == 0) {
    return 64;
  }
#if __has_builtin(__builtin_clzll) || defined(__GNUC__)
  return __builtin_clzll(v);
#elif defined(_MSC_VER) && defined(_M_X64)
  unsigned long count;
  _BitScanReverse64(&count, v);
  return 63 - int(count);
#else
  return v >> 32 ? countLeadingZeroes((uint32_t)(v >> 32))
                 : 32 + countLeadingZeroes((uint32_t)v);
#endif
}